

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

int __thiscall BufferedReader::createReader(BufferedReader *this,int readBuffOffset)

{
  uint32_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *ppRVar4;
  int newReaderID;
  key_type_conflict local_24;
  mapped_type pRVar3;
  
  iVar2 = (*(this->super_AbstractReader)._vptr_AbstractReader[0xe])();
  pRVar3 = (mapped_type)CONCAT44(extraout_var,iVar2);
  uVar1 = (this->super_AbstractReader).m_allocSize;
  pRVar3->m_blockSize = (this->super_AbstractReader).m_blockSize;
  pRVar3->m_allocSize = uVar1;
  pRVar3->m_readOffset = readBuffOffset;
  pRVar3->m_firstBlock = true;
  pRVar3->m_lastBlock = false;
  std::mutex::lock(&this->m_readersMtx);
  iVar2 = createNewReaderID();
  ppRVar4 = std::
            map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
            ::operator[](&this->m_readers,&local_24);
  *ppRVar4 = pRVar3;
  if (this->m_started == false) {
    TerminatableThread::run(&this->super_TerminatableThread);
    this->m_started = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  return iVar2;
}

Assistant:

int BufferedReader::createReader(const int readBuffOffset)
{
    ReaderData* data = intCreateReader();

    data->m_blockSize = m_blockSize;
    data->m_allocSize = m_allocSize;

    data->m_readOffset = readBuffOffset;

    data->m_firstBlock = true;
    data->m_lastBlock = false;

    std::lock_guard lock(m_readersMtx);
    const int newReaderID = createNewReaderID();
    m_readers[newReaderID] = data;
    size_t rSize = m_readers.size();
    if (!m_started)
    {
        run(this);
        m_started = true;
    }
    LTRACE(LT_INFO, 0, "Reader #" << m_id << ". Start new stream " << newReaderID << ". stream(s): " << rSize);

    return newReaderID;
}